

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_gcd(mbedtls_mpi *G,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi *X;
  int iVar1;
  size_t count;
  size_t sVar2;
  int iVar3;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi TG;
  
  iVar3 = 1;
  TG.n = 0;
  TG.p = (mbedtls_mpi_uint *)0x0;
  TA.n = 0;
  TA.p = (mbedtls_mpi_uint *)0x0;
  TB.n = 0;
  TB.p = (mbedtls_mpi_uint *)0x0;
  TB.s = iVar3;
  TA.s = iVar3;
  TG.s = iVar3;
  iVar1 = mbedtls_mpi_copy(&TA,A);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&TB,B), iVar1 == 0)) {
    count = mbedtls_mpi_lsb(&TA);
    sVar2 = mbedtls_mpi_lsb(&TB);
    if (sVar2 < count) {
      count = sVar2;
    }
    iVar1 = mbedtls_mpi_shift_r(&TA,count);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&TB,count), iVar1 == 0)) {
      TB.s = iVar3;
      TA.s = iVar3;
      while (iVar1 = mbedtls_mpi_cmp_int(&TA,0), iVar1 != 0) {
        sVar2 = mbedtls_mpi_lsb(&TA);
        iVar1 = mbedtls_mpi_shift_r(&TA,sVar2);
        if (iVar1 != 0) goto LAB_001182a7;
        sVar2 = mbedtls_mpi_lsb(&TB);
        iVar1 = mbedtls_mpi_shift_r(&TB,sVar2);
        if (iVar1 != 0) goto LAB_001182a7;
        iVar1 = mbedtls_mpi_cmp_mpi(&TA,&TB);
        if (iVar1 < 0) {
          iVar1 = mbedtls_mpi_sub_abs(&TB,&TB,&TA);
          X = &TB;
        }
        else {
          iVar1 = mbedtls_mpi_sub_abs(&TA,&TA,&TB);
          X = &TA;
        }
        if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_shift_r(X,1), iVar1 != 0)) goto LAB_001182a7;
      }
      iVar1 = mbedtls_mpi_shift_l(&TB,count);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_copy(G,&TB);
      }
    }
  }
LAB_001182a7:
  mbedtls_mpi_free(&TG);
  mbedtls_mpi_free(&TA);
  mbedtls_mpi_free(&TB);
  return iVar1;
}

Assistant:

int mbedtls_mpi_gcd( mbedtls_mpi *G, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t lz, lzt;
    mbedtls_mpi TG, TA, TB;

    mbedtls_mpi_init( &TG ); mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );

    lz = mbedtls_mpi_lsb( &TA );
    lzt = mbedtls_mpi_lsb( &TB );

    if( lzt < lz )
        lz = lzt;

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, lz ) );

    TA.s = TB.s = 1;

    while( mbedtls_mpi_cmp_int( &TA, 0 ) != 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, mbedtls_mpi_lsb( &TA ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, mbedtls_mpi_lsb( &TB ) ) );

        if( mbedtls_mpi_cmp_mpi( &TA, &TB ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TA, &TA, &TB ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, 1 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TB, &TB, &TA ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, 1 ) );
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &TB, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( G, &TB ) );

cleanup:

    mbedtls_mpi_free( &TG ); mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TB );

    return( ret );
}